

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.hpp
# Opt level: O2

void viennamath::inplace_simplify<viennamath::rt_expression_interface<double>>
               (rt_expr<viennamath::rt_expression_interface<double>_> *e)

{
  int iVar1;
  auto_ptr_ref<const_viennamath::rt_expression_interface<double>_> __ref;
  undefined4 extraout_var;
  
  while( true ) {
    iVar1 = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[0x11])();
    if ((char)iVar1 == '\0') break;
    __ref._M_ptr._0_4_ = (*((e->rt_expr_)._M_ptr)->_vptr_rt_expression_interface[0x10])();
    __ref._M_ptr._4_4_ = extraout_var;
    std::auto_ptr<const_viennamath::rt_expression_interface<double>_>::operator=(&e->rt_expr_,__ref)
    ;
  }
  return;
}

Assistant:

void inplace_simplify(rt_expr<InterfaceType> & e)
  {
    while (e.get()->can_simplify())
      e = e.get()->simplify();
  }